

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_config.c
# Opt level: O3

int mpt_client_config(mpt_config *cfg,mpt_logger *info)

{
  int iVar1;
  int iVar2;
  mpt_value *pmVar3;
  char *val;
  mpt_iterator *it;
  void *ptr;
  mpt_iterator *local_38;
  void *local_30;
  
  local_38 = (mpt_iterator *)0x0;
  iVar1 = mpt_config_get((mpt_config *)0x0,"mpt.args",0x86,&local_38);
  iVar2 = 0;
  if (local_38 != (mpt_iterator *)0x0 && 0 < iVar1) {
    pmVar3 = (*local_38->_vptr->value)(local_38);
    if (pmVar3 == (mpt_value *)0x0) {
      iVar2 = 0;
      mpt_log(info,"mpt_client_config",8,"%s","no client config filename");
    }
    else {
      local_30 = pmVar3->_addr;
      val = mpt_data_tostring(&local_30,pmVar3->_type,(size_t *)0x0);
      if (val == (char *)0x0) {
        mpt_log(info,"mpt_client_config",3,"%s","bad client config filename");
        iVar2 = iVar1;
      }
      else {
        iVar2 = mpt_config_set(cfg,(char *)0x0,val,0,0);
        if (iVar2 < 0) {
          mpt_log(info,"mpt_client_config",3,"%s: %s","failed to set client config",val);
        }
        else {
          if (info == (mpt_logger *)0x0) {
            info = mpt_log_default();
          }
          iVar2 = (*local_38->_vptr->advance)(local_38);
          if (0 < iVar2) {
            iVar2 = mpt_config_args(cfg,local_38,info);
            iVar2 = (uint)(0 < iVar2) + iVar2;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

extern int mpt_client_config(MPT_INTERFACE(config) *cfg, MPT_INTERFACE(logger) *info)
{
	MPT_INTERFACE(iterator) *it;
	const MPT_STRUCT(value) *val;
	const void *ptr;
	const char *str;
	int ret;
	
	it = 0;
	if ((ret = mpt_config_get(0, "mpt.args", MPT_ENUM(TypeIteratorPtr), &it)) <= 0
	    || !it) {
		return 0;
	}
	/* set config file */
	if (!(val = it->_vptr->value(it))) {
		mpt_log(info, __func__, MPT_LOG(Info), "%s",
		        MPT_tr("no client config filename"));
		return 0;
	}
	ptr = val->_addr;
	if (!(str = mpt_data_tostring(&ptr, val->_type, 0))) {
		mpt_log(info, __func__, MPT_LOG(Error), "%s",
		        MPT_tr("bad client config filename"));
		return ret;
	}
	if ((ret = mpt_config_set(cfg, 0, str, 0, 0)) < 0) {
		mpt_log(info, __func__, MPT_LOG(Error), "%s: %s",
		        MPT_tr("failed to set client config"), str);
		return ret;
	}
	if (!info) {
		info = mpt_log_default();
	}
	/* apply config settings */
	if ((ret = it->_vptr->advance(it)) > 0
	    && (ret = mpt_config_args(cfg, it, info))) {
		if (ret >= 0) {
			++ret;
		}
	}
	return ret;
}